

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canNodump(void)

{
  uint local_24;
  int local_20;
  wchar_t flags;
  wchar_t r;
  wchar_t fd;
  char *path;
  
  _r = "cannodumptest";
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                      ,L'ઘ',"cannodumptest",L'Ƥ',L'\0',(void *)0x0);
  flags = open(_r,0x800);
  if (flags < L'\0') {
    path._4_4_ = L'\0';
  }
  else {
    local_20 = ioctl(flags,0x80086601,&local_24);
    if (local_20 < 0) {
      path._4_4_ = L'\0';
    }
    else {
      local_24 = local_24 | 0x40;
      local_20 = ioctl(flags,0x40086602,&local_24);
      if (local_20 < 0) {
        path._4_4_ = L'\0';
      }
      else {
        close(flags);
        flags = open(_r,0x800);
        if (flags < L'\0') {
          path._4_4_ = L'\0';
        }
        else {
          local_20 = ioctl(flags,0x80086601,&local_24);
          if (local_20 < 0) {
            path._4_4_ = L'\0';
          }
          else {
            close(flags);
            if ((local_24 & 0x40) == 0) {
              path._4_4_ = L'\0';
            }
            else {
              path._4_4_ = L'\x01';
            }
          }
        }
      }
    }
  }
  return path._4_4_;
}

Assistant:

int
canNodump(void)
{
#if defined(HAVE_STRUCT_STAT_ST_FLAGS) && defined(UF_NODUMP)
	const char *path = "cannodumptest";
	struct stat sb;

	assertion_make_file(__FILE__, __LINE__, path, 0644, 0, NULL);
	if (chflags(path, UF_NODUMP) < 0)
		return (0);
	if (stat(path, &sb) < 0)
		return (0);
	if (sb.st_flags & UF_NODUMP)
		return (1);
#elif (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS) \
	 && defined(FS_NODUMP_FL)) || \
      (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS) \
	 && defined(EXT2_NODUMP_FL))
	const char *path = "cannodumptest";
	int fd, r, flags;

	assertion_make_file(__FILE__, __LINE__, path, 0644, 0, NULL);
	fd = open(path, O_RDONLY | O_NONBLOCK);
	if (fd < 0)
		return (0);
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flags);
	if (r < 0)
		return (0);
#ifdef FS_NODUMP_FL
	flags |= FS_NODUMP_FL;
#else
	flags |= EXT2_NODUMP_FL;
#endif
	r = ioctl(fd,
#ifdef FS_IOC_SETFLAGS
	    FS_IOC_SETFLAGS,
#else
	    EXT2_IOC_SETFLAGS,
#endif
	   &flags);
	if (r < 0)
		return (0);
	close(fd);
	fd = open(path, O_RDONLY | O_NONBLOCK);
	if (fd < 0)
		return (0);
	r = ioctl(fd,
#ifdef FS_IOC_GETFLAGS
	    FS_IOC_GETFLAGS,
#else
	    EXT2_IOC_GETFLAGS,
#endif
	    &flags);
	if (r < 0)
		return (0);
	close(fd);
#ifdef FS_NODUMP_FL
	if (flags & FS_NODUMP_FL)
#else
	if (flags & EXT2_NODUMP_FL)
#endif
		return (1);
#endif
	return (0);
}